

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O3

void __thiscall node::calc(node *this,int id,double X,double Y,double Z)

{
  vec3 *pvVar1;
  int iVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  vec3 *pvVar8;
  
  dVar7 = SQRT(X * X + Y * Y);
  dVar3 = atan2(Z * 6378137.0,dVar7 * 6356752.3142);
  dVar4 = sin(dVar3);
  dVar3 = cos(dVar3);
  dVar3 = atan((dVar4 * 42841.311603977185 * dVar4 * dVar4 + Z) /
               (dVar3 * -42697.67270717997 * dVar3 * dVar3 + dVar7));
  dVar4 = atan2(Y,X);
  dVar5 = sin(dVar3);
  dVar5 = dVar5 * -0.0066943799901413165 * dVar5 + 1.0;
  if (dVar5 < 0.0) {
    dVar5 = sqrt(dVar5);
  }
  else {
    dVar5 = SQRT(dVar5);
  }
  dVar6 = cos(dVar3);
  pvVar8 = points_wgs84;
  iVar2 = this->id;
  pvVar1 = points_wgs84 + iVar2;
  pvVar1->field_0 = (anon_union_4_3_4e90da17_for_vec<3,_float,_(glm::qualifier)0>_3)(float)dVar4;
  pvVar1->field_1 = (anon_union_4_3_4e90b0ec_for_vec<3,_float,_(glm::qualifier)0>_5)(float)dVar3;
  pvVar8[iVar2].field_2.z = (float)(dVar7 / dVar6 + -6378137.0 / dVar5);
  return;
}

Assistant:

void node::calc(int id, double X, double Y, double Z){
    double _radiusEquator = 6378137;
    double _radiusPolar =  6356752.3142;
    double f = 1/298.257223563;
    double _eccentricitySquared = 2*f - pow(f,2);
    double p = sqrt(X*X + Y*Y);

    double theta = atan2(Z*_radiusEquator , (p*_radiusPolar));

    double eDashSquared = (_radiusEquator*_radiusEquator - _radiusPolar*_radiusPolar)/
                          (_radiusPolar*_radiusPolar);


    double sin_theta = sin(theta);

    double cos_theta = cos(theta);


    double latitude = atan( (Z + eDashSquared*_radiusPolar*sin_theta*sin_theta*sin_theta) /
                            (p - _eccentricitySquared*_radiusEquator*cos_theta*cos_theta*cos_theta) );

    double longitude = atan2(Y,X);


    double sin_latitude = sin(latitude);

    double N = _radiusEquator / sqrt( 1.0 - _eccentricitySquared*sin_latitude*sin_latitude);


    double height = p/cos(latitude) - N;
//    points->replace(id,QVector3D(latitude,longitude,height));
    //DoSomething
    points_wgs84[this->id] = glm::vec3(longitude,latitude,height);
}